

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

float __thiscall
tcu::Texture2DArrayView::sampleCompareOffset
          (Texture2DArrayView *this,Sampler *sampler,float ref,float s,float t,float r,float lod,
          IVec2 *offset)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  IVec3 local_2c;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  uVar1 = *(undefined8 *)offset->m_data;
  fVar4 = floorf(r + 0.5);
  iVar2 = (int)fVar4;
  iVar3 = (levels->m_size).m_data[2] + -1;
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  local_2c.m_data[2] = 0;
  if (-1 < iVar2) {
    local_2c.m_data[2] = iVar3;
  }
  local_2c.m_data._0_8_ = uVar1;
  fVar4 = sampleLevelArray2DCompare(levels,numLevels,sampler,ref,s,t,lod,&local_2c);
  return fVar4;
}

Assistant:

float Texture2DArrayView::sampleCompareOffset (const Sampler& sampler, float ref, float s, float t, float r, float lod, const IVec2& offset) const
{
	return sampleLevelArray2DCompare(m_levels, m_numLevels, sampler, ref, s, t, lod, IVec3(offset.x(), offset.y(), selectLayer(r)));
}